

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * google::protobuf::internal::InlineGreedyStringParser(string *s,char *ptr,ParseContext *ctx)

{
  uint32 size;
  char *pcVar1;
  char *local_20;
  
  local_20 = ptr;
  size = ReadSize(&local_20);
  if (local_20 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,local_20,size,s);
  }
  return pcVar1;
}

Assistant:

const char* InlineGreedyStringParser(std::string* s, const char* ptr,
                                     ParseContext* ctx) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  return ctx->ReadString(ptr, size, s);
}